

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O3

void apply_filter(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,arguments *args,char **argv,
                 int argc)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00158610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Optimizing Parameters :",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,color::reset_abi_cxx11_,DAT_00158670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  apply_brightness(image_list,args->brightness_value);
  apply_contrast(image_list,args->contrast_value);
  apply_saturation(image_list,args->saturation_value);
  apply_sharpen(image_list,args->sharpness_value);
  apply_blur(image_list,args->blur_value);
  return;
}

Assistant:

void apply_filter(std::vector<cv::Mat> &image_list, arguments args, char *argv[], int argc) {
   std::cout << color::blue << "Optimizing Parameters :" << color::reset << std::endl;
   
   apply_brightness(image_list, args.brightness_value);
   apply_contrast(image_list, args.contrast_value);
   apply_saturation(image_list, args.saturation_value);
   apply_sharpen(image_list, args.sharpness_value);
   apply_blur(image_list, args.blur_value);
}